

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O2

int secp256k1_eckey_pubkey_serialize(secp256k1_ge *elem,uchar *pub,size_t *size,int compressed)

{
  secp256k1_fe *r;
  int iVar1;
  int iVar2;
  
  if ((uint)compressed < 2) {
    iVar1 = secp256k1_ge_is_infinity(elem);
    iVar2 = 0;
    if (iVar1 == 0) {
      secp256k1_fe_normalize_var(&elem->x);
      r = &elem->y;
      secp256k1_fe_normalize_var(r);
      secp256k1_fe_get_b32(pub + 1,&elem->x);
      if (compressed == 0) {
        *size = 0x41;
        *pub = '\x04';
        secp256k1_fe_get_b32(pub + 0x21,r);
      }
      else {
        *size = 0x21;
        iVar1 = secp256k1_fe_is_odd(r);
        *pub = iVar1 == 0 ^ 3;
      }
      iVar2 = 1;
    }
    return iVar2;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/eckey_impl.h"
          ,0x27,"test condition failed: compressed == 0 || compressed == 1");
  abort();
}

Assistant:

static int secp256k1_eckey_pubkey_serialize(secp256k1_ge *elem, unsigned char *pub, size_t *size, int compressed) {
    VERIFY_CHECK(compressed == 0 || compressed == 1);

    if (secp256k1_ge_is_infinity(elem)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&elem->x);
    secp256k1_fe_normalize_var(&elem->y);
    secp256k1_fe_get_b32(&pub[1], &elem->x);
    if (compressed) {
        *size = 33;
        pub[0] = secp256k1_fe_is_odd(&elem->y) ? SECP256K1_TAG_PUBKEY_ODD : SECP256K1_TAG_PUBKEY_EVEN;
    } else {
        *size = 65;
        pub[0] = SECP256K1_TAG_PUBKEY_UNCOMPRESSED;
        secp256k1_fe_get_b32(&pub[33], &elem->y);
    }
    return 1;
}